

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

string * __thiscall
nonius::detail::pretty_duration_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,fp_seconds secs)

{
  ostream *poVar1;
  ostringstream ss;
  char local_1b1;
  char *local_1b0;
  long local_1a8;
  undefined2 local_1a0;
  undefined1 uStack_19e;
  undefined1 uStack_19d;
  undefined4 uStack_19c;
  double local_190;
  double local_188;
  long local_180;
  long local_178 [13];
  ios_base local_110 [264];
  
  if (2.0 <= secs.__r) {
    local_190 = 1.0;
  }
  else if (0.002 <= secs.__r) {
    local_190 = 1000.0;
  }
  else {
    local_190 = *(double *)(&DAT_0016c2d0 + (ulong)(secs.__r < 2e-06) * 8);
  }
  if (local_190 <= 1.0) {
    local_1a0 = 0x73;
    local_1a8 = 1;
  }
  else if (local_190 <= 1000.0) {
    local_1a0 = 0x736d;
    local_1a8 = 2;
    uStack_19e = 0;
  }
  else if (local_190 <= 1000000.0) {
    uStack_19e = 0x73;
    local_1a0 = 0xbcce;
    local_1a8 = 3;
    uStack_19d = 0;
  }
  else {
    local_1a0 = 0x736e;
    local_1a8 = 2;
    uStack_19e = 0;
  }
  local_1b0 = (char *)&local_1a0;
  local_188 = secs.__r;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_180);
  *(long *)((long)local_178 + *(long *)(local_180 + -0x18)) =
       (long)*(int *)((long)local_178 + *(long *)(local_180 + -0x18));
  poVar1 = std::ostream::_M_insert<double>(local_190 * local_188);
  local_1b1 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1b0,local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_180);
  std::ios_base::~ios_base(local_110);
  if (local_1b0 != (char *)&local_1a0) {
    operator_delete(local_1b0,
                    CONCAT44(uStack_19c,CONCAT13(uStack_19d,CONCAT12(uStack_19e,local_1a0))) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string pretty_duration(fp_seconds secs) {
            auto magnitude = get_magnitude(secs);
            auto units = units_for_magnitude(magnitude);
#ifdef NONIUS_MSVC
            if(units == "μs") units = "us";
#endif
            std::ostringstream ss;
            ss << std::setprecision(ss.precision());
            ss << (secs.count() * magnitude) << ' ' << units;
            return ss.str();
        }